

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx::SphereMiIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  RayHitK<8> *pRVar17;
  Scene *pSVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  float fVar41;
  float fVar42;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<8> h;
  undefined1 local_340 [16];
  Scene *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  Primitive *local_2e8;
  undefined8 *local_2e0;
  void *local_2d8;
  RTCRayQueryContext *local_2d0;
  RayHitK<8> *local_2c8;
  undefined1 (*local_2c0) [32];
  undefined4 local_2b8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar18;
  undefined1 auVar54 [64];
  undefined1 auVar56 [64];
  
  pSVar19 = context->scene;
  pGVar4 = (pSVar19->geometries).items[sphere->sharedGeomID].ptr;
  lVar20 = *(long *)&pGVar4->field_0x58;
  _Var5 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar37 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[0] * _Var5);
  auVar32 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[1] * _Var5);
  auVar57 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[2] * _Var5);
  auVar53 = *(undefined1 (*) [16])(lVar20 + (sphere->primIDs).field_0.i[3] * _Var5);
  auVar44 = vunpcklps_avx(auVar37,auVar57);
  auVar37 = vunpckhps_avx(auVar37,auVar57);
  auVar57 = vunpcklps_avx(auVar32,auVar53);
  auVar32 = vunpckhps_avx(auVar32,auVar53);
  auVar53 = vunpcklps_avx(auVar44,auVar57);
  auVar57 = vunpckhps_avx(auVar44,auVar57);
  auVar30 = vunpcklps_avx(auVar37,auVar32);
  auVar46 = vunpckhps_avx(auVar37,auVar32);
  auVar37 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar32 = vpcmpgtd_avx(auVar37,_DAT_01ff0cf0);
  local_190 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar16 = *(undefined4 *)(ray + k * 4);
  auVar52._4_4_ = uVar16;
  auVar52._0_4_ = uVar16;
  auVar52._8_4_ = uVar16;
  auVar52._12_4_ = uVar16;
  auVar53 = vsubps_avx(auVar53,auVar52);
  uVar16 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar44._4_4_ = uVar16;
  auVar44._0_4_ = uVar16;
  auVar44._8_4_ = uVar16;
  auVar44._12_4_ = uVar16;
  auVar44 = vsubps_avx(auVar57,auVar44);
  uVar16 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar37._4_4_ = uVar16;
  auVar37._0_4_ = uVar16;
  auVar37._8_4_ = uVar16;
  auVar37._12_4_ = uVar16;
  auVar30 = vsubps_avx(auVar30,auVar37);
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar64 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)(ray + k * 4 + 0xa0);
  auVar65 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0xc0);
  auVar66 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar37 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar57 = vshufps_avx(auVar37,auVar37,0);
  auVar37 = vrcpps_avx(auVar57);
  fVar36 = auVar37._0_4_;
  auVar38._0_4_ = fVar36 * auVar57._0_4_;
  fVar41 = auVar37._4_4_;
  auVar38._4_4_ = fVar41 * auVar57._4_4_;
  fVar42 = auVar37._8_4_;
  auVar38._8_4_ = fVar42 * auVar57._8_4_;
  fVar43 = auVar37._12_4_;
  auVar38._12_4_ = fVar43 * auVar57._12_4_;
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = &DAT_3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar57,auVar38);
  fVar36 = fVar36 + fVar36 * auVar37._0_4_;
  fVar41 = fVar41 + fVar41 * auVar37._4_4_;
  fVar42 = fVar42 + fVar42 * auVar37._8_4_;
  fVar43 = fVar43 + fVar43 * auVar37._12_4_;
  auVar45._0_4_ = (fVar1 * auVar53._0_4_ + fVar2 * auVar44._0_4_ + fVar3 * auVar30._0_4_) * fVar36;
  auVar45._4_4_ = (fVar1 * auVar53._4_4_ + fVar2 * auVar44._4_4_ + fVar3 * auVar30._4_4_) * fVar41;
  auVar45._8_4_ = (fVar1 * auVar53._8_4_ + fVar2 * auVar44._8_4_ + fVar3 * auVar30._8_4_) * fVar42;
  auVar45._12_4_ =
       (fVar1 * auVar53._12_4_ + fVar2 * auVar44._12_4_ + fVar3 * auVar30._12_4_) * fVar43;
  auVar58._0_4_ = fVar1 * auVar45._0_4_;
  auVar58._4_4_ = fVar1 * auVar45._4_4_;
  auVar58._8_4_ = fVar1 * auVar45._8_4_;
  auVar58._12_4_ = fVar1 * auVar45._12_4_;
  auVar60._0_4_ = fVar2 * auVar45._0_4_;
  auVar60._4_4_ = fVar2 * auVar45._4_4_;
  auVar60._8_4_ = fVar2 * auVar45._8_4_;
  auVar60._12_4_ = fVar2 * auVar45._12_4_;
  auVar62._0_4_ = fVar3 * auVar45._0_4_;
  auVar62._4_4_ = fVar3 * auVar45._4_4_;
  auVar62._8_4_ = fVar3 * auVar45._8_4_;
  auVar62._12_4_ = fVar3 * auVar45._12_4_;
  auVar57 = vsubps_avx(auVar53,auVar58);
  auVar59 = ZEXT1664(auVar57);
  auVar53 = vsubps_avx(auVar44,auVar60);
  auVar61 = ZEXT1664(auVar53);
  auVar44 = vsubps_avx(auVar30,auVar62);
  auVar63 = ZEXT1664(auVar44);
  auVar49._0_4_ =
       auVar57._0_4_ * auVar57._0_4_ + auVar53._0_4_ * auVar53._0_4_ + auVar44._0_4_ * auVar44._0_4_
  ;
  auVar49._4_4_ =
       auVar57._4_4_ * auVar57._4_4_ + auVar53._4_4_ * auVar53._4_4_ + auVar44._4_4_ * auVar44._4_4_
  ;
  auVar49._8_4_ =
       auVar57._8_4_ * auVar57._8_4_ + auVar53._8_4_ * auVar53._8_4_ + auVar44._8_4_ * auVar44._8_4_
  ;
  auVar49._12_4_ =
       auVar57._12_4_ * auVar57._12_4_ +
       auVar53._12_4_ * auVar53._12_4_ + auVar44._12_4_ * auVar44._12_4_;
  auVar29._0_4_ = auVar46._0_4_ * auVar46._0_4_;
  auVar29._4_4_ = auVar46._4_4_ * auVar46._4_4_;
  auVar29._8_4_ = auVar46._8_4_ * auVar46._8_4_;
  auVar29._12_4_ = auVar46._12_4_ * auVar46._12_4_;
  auVar37 = vcmpps_avx(auVar49,auVar29,2);
  auVar30 = auVar32 & auVar37;
  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0') {
    auVar37 = vandps_avx(auVar37,auVar32);
    auVar32 = vsubps_avx(auVar29,auVar49);
    auVar30._0_4_ = fVar36 * auVar32._0_4_;
    auVar30._4_4_ = fVar41 * auVar32._4_4_;
    auVar30._8_4_ = fVar42 * auVar32._8_4_;
    auVar30._12_4_ = fVar43 * auVar32._12_4_;
    auVar29 = vsqrtps_avx(auVar30);
    auVar67 = ZEXT1664(auVar29);
    auVar38 = vsubps_avx(auVar45,auVar29);
    auVar55._0_4_ = auVar29._0_4_ + auVar45._0_4_;
    auVar55._4_4_ = auVar29._4_4_ + auVar45._4_4_;
    auVar55._8_4_ = auVar29._8_4_ + auVar45._8_4_;
    auVar55._12_4_ = auVar29._12_4_ + auVar45._12_4_;
    auVar56 = ZEXT1664(auVar55);
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar46._4_4_ = uVar16;
    auVar46._0_4_ = uVar16;
    auVar46._8_4_ = uVar16;
    auVar46._12_4_ = uVar16;
    auVar32 = vcmpps_avx(auVar46,auVar38,2);
    uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar50._4_4_ = uVar16;
    auVar50._0_4_ = uVar16;
    auVar50._8_4_ = uVar16;
    auVar50._12_4_ = uVar16;
    auVar30 = vcmpps_avx(auVar38,auVar50,2);
    auVar32 = vandps_avx(auVar30,auVar32);
    auVar68 = ZEXT1664(auVar32);
    auVar32 = vandps_avx(auVar32,auVar37);
    auVar30 = vcmpps_avx(auVar46,auVar55,2);
    auVar46 = vcmpps_avx(auVar55,auVar50,2);
    auVar30 = vandps_avx(auVar30,auVar46);
    auVar37 = vandps_avx(auVar30,auVar37);
    auVar69 = ZEXT1664(auVar37);
    local_340 = vorps_avx(auVar37,auVar32);
    if ((((local_340 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_340 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_340 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_340[0xf] < '\0') {
      local_2b0 = vblendvps_avx(auVar55,auVar38,auVar32);
      auVar51 = ZEXT1664(local_2b0);
      auVar31._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
      auVar31._8_4_ = -auVar29._8_4_;
      auVar31._12_4_ = -auVar29._12_4_;
      auVar37 = vblendvps_avx(auVar29,auVar31,auVar32);
      fVar36 = auVar37._0_4_;
      auVar39._0_4_ = fVar1 * fVar36;
      fVar41 = auVar37._4_4_;
      auVar39._4_4_ = fVar1 * fVar41;
      fVar42 = auVar37._8_4_;
      auVar39._8_4_ = fVar1 * fVar42;
      fVar43 = auVar37._12_4_;
      auVar39._12_4_ = fVar1 * fVar43;
      auVar47._0_4_ = fVar2 * fVar36;
      auVar47._4_4_ = fVar2 * fVar41;
      auVar47._8_4_ = fVar2 * fVar42;
      auVar47._12_4_ = fVar2 * fVar43;
      auVar32._0_4_ = fVar3 * fVar36;
      auVar32._4_4_ = fVar3 * fVar41;
      auVar32._8_4_ = fVar3 * fVar42;
      auVar32._12_4_ = fVar3 * fVar43;
      local_2a0 = vsubps_avx(auVar39,auVar57);
      local_290 = vsubps_avx(auVar47,auVar53);
      local_280 = vsubps_avx(auVar32,auVar44);
      auVar53._8_4_ = 0x7f800000;
      auVar53._0_8_ = 0x7f8000007f800000;
      auVar53._12_4_ = 0x7f800000;
      auVar54 = ZEXT1664(auVar53);
      auVar37 = vblendvps_avx(auVar53,local_2b0,local_340);
      auVar32 = vshufps_avx(auVar37,auVar37,0xb1);
      auVar32 = vminps_avx(auVar32,auVar37);
      auVar57 = vshufpd_avx(auVar32,auVar32,1);
      auVar32 = vminps_avx(auVar57,auVar32);
      auVar37 = vcmpps_avx(auVar37,auVar32,0);
      auVar57 = local_340 & auVar37;
      auVar32 = vpcmpeqd_avx(auVar32,auVar32);
      if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar57[0xf] < '\0'
         ) {
        auVar32 = auVar37;
      }
      auVar37 = vandps_avx(local_340,auVar32);
      uVar14 = vmovmskps_avx(auVar37);
      lVar20 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar14 = 1 << ((byte)k & 0x1f);
      uVar21 = (ulong)((uVar14 & 0xf) << 4);
      local_328 = (Scene *)(mm_lookupmask_ps + (long)((int)uVar14 >> 4) * 0x10);
      local_1c0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      do {
        auVar57 = auVar63._0_16_;
        auVar37 = auVar59._0_16_;
        local_2e0 = &local_320;
        auVar32 = auVar61._0_16_;
        auVar30 = auVar66._0_16_;
        auVar44 = auVar65._0_16_;
        auVar46 = auVar67._0_16_;
        auVar53 = auVar64._0_16_;
        auVar38 = auVar69._0_16_;
        auVar29 = auVar68._0_16_;
        uVar14 = *(uint *)(local_190 + lVar20 * 4);
        pRVar17 = (RayHitK<8> *)(ulong)uVar14;
        pGVar4 = (pSVar19->geometries).items[(long)pRVar17].ptr;
        local_2c8 = ray;
        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_340 + lVar20 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2b0 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2a0 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_290 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_280 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar20];
            *(uint *)(ray + k * 4 + 0x240) = uVar14;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            uVar16 = 0;
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_00ea1d59:
            uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar23._4_4_ = uVar15;
            auVar23._0_4_ = uVar15;
            auVar23._8_4_ = uVar15;
            auVar23._12_4_ = uVar15;
            local_2b0 = auVar56._0_16_;
            auVar45 = vcmpps_avx(local_2b0,auVar23,2);
            auVar29 = vandps_avx(auVar29,auVar45);
            auVar45 = auVar38 & auVar29;
            if ((((auVar45 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar45 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar45 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar45[0xf]) {
              return;
            }
            local_340 = vandps_avx(auVar38,auVar29);
            fVar1 = auVar46._0_4_;
            auVar33._0_4_ = auVar53._0_4_ * fVar1;
            fVar2 = auVar46._4_4_;
            auVar33._4_4_ = auVar53._4_4_ * fVar2;
            fVar3 = auVar46._8_4_;
            auVar33._8_4_ = auVar53._8_4_ * fVar3;
            fVar36 = auVar46._12_4_;
            auVar33._12_4_ = auVar53._12_4_ * fVar36;
            auVar40._0_4_ = auVar44._0_4_ * fVar1;
            auVar40._4_4_ = auVar44._4_4_ * fVar2;
            auVar40._8_4_ = auVar44._8_4_ * fVar3;
            auVar40._12_4_ = auVar44._12_4_ * fVar36;
            auVar48._0_4_ = auVar30._0_4_ * fVar1;
            auVar48._4_4_ = auVar30._4_4_ * fVar2;
            auVar48._8_4_ = auVar30._8_4_ * fVar3;
            auVar48._12_4_ = auVar30._12_4_ * fVar36;
            local_2a0 = vsubps_avx(auVar33,auVar37);
            local_290 = vsubps_avx(auVar40,auVar32);
            local_280 = vsubps_avx(auVar48,auVar57);
            pSVar19 = context->scene;
            auVar37 = vblendvps_avx(auVar54._0_16_,local_2b0,local_340);
            auVar32 = vshufps_avx(auVar37,auVar37,0xb1);
            auVar32 = vminps_avx(auVar32,auVar37);
            auVar57 = vshufpd_avx(auVar32,auVar32,1);
            auVar32 = vminps_avx(auVar57,auVar32);
            auVar32 = vcmpps_avx(auVar37,auVar32,0);
            auVar57 = local_340 & auVar32;
            auVar37 = local_340;
            if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar57[0xf] < '\0') {
              auVar37 = vandps_avx(auVar32,local_340);
            }
            uVar15 = vmovmskps_avx(auVar37);
            lVar20 = 0;
            if (CONCAT44(uVar16,uVar15) != 0) {
              for (; (CONCAT44(uVar16,uVar15) >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            uVar14 = 1 << ((byte)k & 0x1f);
            uVar21 = (ulong)((uVar14 & 0xf) << 4);
            local_1c0._0_8_ = mm_lookupmask_ps + (long)((int)uVar14 >> 4) * 0x10;
            auVar37 = ZEXT816(0) << 0x40;
            auVar59 = ZEXT1664(auVar37);
            auVar25 = vcmpps_avx(ZEXT1632(auVar37),ZEXT1632(auVar37),0xf);
            auVar61 = ZEXT3264(auVar25);
            auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              local_2e0 = &local_320;
              uVar14 = *(uint *)(local_190 + lVar20 * 4);
              pRVar17 = (RayHitK<8> *)(ulong)uVar14;
              pGVar4 = (pSVar19->geometries).items[(long)pRVar17].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_340 + lVar20 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2b0 + lVar20 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_2a0 + lVar20 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_290 + lVar20 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_280 + lVar20 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[lVar20];
                  *(uint *)(ray + k * 4 + 0x240) = uVar14;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_e0 = (sphere->primIDs).field_0.i[lVar20];
                local_180._0_4_ = *(undefined4 *)(local_2a0 + lVar20 * 4);
                local_160 = *(undefined4 *)(local_290 + lVar20 * 4);
                auStack_b0 = vpshufd_avx(ZEXT416(uVar14),0);
                uVar16 = *(undefined4 *)(local_280 + lVar20 * 4);
                local_140._4_4_ = uVar16;
                local_140._0_4_ = uVar16;
                local_140._8_4_ = uVar16;
                local_140._12_4_ = uVar16;
                local_140._16_4_ = uVar16;
                local_140._20_4_ = uVar16;
                local_140._24_4_ = uVar16;
                local_140._28_4_ = uVar16;
                local_180._4_4_ = local_180._0_4_;
                local_180._8_4_ = local_180._0_4_;
                local_180._12_4_ = local_180._0_4_;
                local_180._16_4_ = local_180._0_4_;
                local_180._20_4_ = local_180._0_4_;
                local_180._24_4_ = local_180._0_4_;
                local_180._28_4_ = local_180._0_4_;
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_100 = auVar59._0_32_;
                local_120 = auVar59._0_32_;
                uStack_dc = local_e0;
                uStack_d8 = local_e0;
                uStack_d4 = local_e0;
                uStack_d0 = local_e0;
                uStack_cc = local_e0;
                uStack_c8 = local_e0;
                uStack_c4 = local_e0;
                local_c0 = auStack_b0;
                local_1e0 = auVar61._0_32_;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2b0 + lVar20 * 4);
                local_320 = *(undefined8 *)(mm_lookupmask_ps + uVar21);
                uStack_318 = *(undefined8 *)(mm_lookupmask_ps + uVar21 + 8);
                local_310 = *(undefined8 *)local_1c0._0_8_;
                uStack_308 = *(undefined8 *)(local_1c0._0_8_ + 8);
                local_2d8 = pGVar4->userPtr;
                local_2d0 = context->user;
                local_2c0 = &local_180;
                local_2b8 = 8;
                pRVar17 = (RayHitK<8> *)pGVar4->intersectionFilterN;
                local_328 = pSVar19;
                local_2c8 = ray;
                if (pRVar17 != (RayHitK<8> *)0x0) {
                  local_300 = auVar56._0_16_;
                  local_2e8 = sphere;
                  pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2e0);
                  auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar61 = ZEXT3264(local_1e0);
                  auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar56 = ZEXT1664(local_300);
                  sphere = local_2e8;
                }
                auVar8._8_8_ = uStack_318;
                auVar8._0_8_ = local_320;
                auVar37 = vpcmpeqd_avx(auVar63._0_16_,auVar8);
                auVar12._8_8_ = uStack_308;
                auVar12._0_8_ = local_310;
                auVar32 = vpcmpeqd_avx(auVar63._0_16_,auVar12);
                auVar27._16_16_ = auVar32;
                auVar27._0_16_ = auVar37;
                local_1e0 = auVar61._0_32_;
                auVar25 = local_1e0 & ~auVar27;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar25 >> 0x7f,0) == '\0') &&
                      (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0xbf,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar25[0x1f]) {
                  auVar28._0_4_ = auVar61._0_4_ ^ auVar37._0_4_;
                  auVar28._4_4_ = auVar61._4_4_ ^ auVar37._4_4_;
                  auVar28._8_4_ = auVar61._8_4_ ^ auVar37._8_4_;
                  auVar28._12_4_ = auVar61._12_4_ ^ auVar37._12_4_;
                  auVar28._16_4_ = auVar61._16_4_ ^ auVar32._0_4_;
                  auVar28._20_4_ = auVar61._20_4_ ^ auVar32._4_4_;
                  auVar28._24_4_ = auVar61._24_4_ ^ auVar32._8_4_;
                  auVar28._28_4_ = auVar61._28_4_ ^ auVar32._12_4_;
                  pSVar19 = local_328;
                }
                else {
                  pRVar17 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar17 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_300 = auVar56._0_16_;
                    pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)();
                    auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar61 = ZEXT3264(local_1e0);
                    auVar59 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar56 = ZEXT1664(local_300);
                  }
                  auVar9._8_8_ = uStack_318;
                  auVar9._0_8_ = local_320;
                  auVar37 = vpcmpeqd_avx(auVar63._0_16_,auVar9);
                  auVar13._8_8_ = uStack_308;
                  auVar13._0_8_ = local_310;
                  auVar32 = vpcmpeqd_avx(auVar63._0_16_,auVar13);
                  auVar35._16_16_ = auVar32;
                  auVar35._0_16_ = auVar37;
                  auVar28._0_4_ = auVar61._0_4_ ^ auVar37._0_4_;
                  auVar28._4_4_ = auVar61._4_4_ ^ auVar37._4_4_;
                  auVar28._8_4_ = auVar61._8_4_ ^ auVar37._8_4_;
                  auVar28._12_4_ = auVar61._12_4_ ^ auVar37._12_4_;
                  auVar28._16_4_ = auVar61._16_4_ ^ auVar32._0_4_;
                  auVar28._20_4_ = auVar61._20_4_ ^ auVar32._4_4_;
                  auVar28._24_4_ = auVar61._24_4_ ^ auVar32._8_4_;
                  auVar28._28_4_ = auVar61._28_4_ ^ auVar32._12_4_;
                  auVar25 = auVar61._0_32_ & ~auVar35;
                  pSVar19 = local_328;
                  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar25 >> 0x7f,0) != '\0') ||
                        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0xbf,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar25[0x1f] < '\0') {
                    auVar25 = vmaskmovps_avx(auVar28,*local_2c0);
                    *(undefined1 (*) [32])(local_2c8 + 0x180) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[1]);
                    *(undefined1 (*) [32])(local_2c8 + 0x1a0) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[2]);
                    *(undefined1 (*) [32])(local_2c8 + 0x1c0) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[3]);
                    *(undefined1 (*) [32])(local_2c8 + 0x1e0) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[4]);
                    *(undefined1 (*) [32])(local_2c8 + 0x200) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[5]);
                    *(undefined1 (*) [32])(local_2c8 + 0x220) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[6]);
                    *(undefined1 (*) [32])(local_2c8 + 0x240) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[7]);
                    *(undefined1 (*) [32])(local_2c8 + 0x260) = auVar25;
                    auVar25 = vmaskmovps_avx(auVar28,local_2c0[8]);
                    *(undefined1 (*) [32])(local_2c8 + 0x280) = auVar25;
                    pRVar17 = local_2c8;
                  }
                }
                if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar28 >> 0x7f,0) == '\0') &&
                      (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar28 >> 0xbf,0) == '\0') &&
                    (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar28[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar16;
                }
                *(undefined4 *)(local_340 + lVar20 * 4) = 0;
                uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar24._4_4_ = uVar16;
                auVar24._0_4_ = uVar16;
                auVar24._8_4_ = uVar16;
                auVar24._12_4_ = uVar16;
                auVar37 = vcmpps_avx(auVar56._0_16_,auVar24,2);
                local_340 = vandps_avx(auVar37,local_340);
              }
              if ((((local_340 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_340 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_340 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_340[0xf]) {
                return;
              }
              auVar37 = vblendvps_avx(auVar54._0_16_,auVar56._0_16_,local_340);
              auVar32 = vshufps_avx(auVar37,auVar37,0xb1);
              auVar32 = vminps_avx(auVar32,auVar37);
              auVar57 = vshufpd_avx(auVar32,auVar32,1);
              auVar32 = vminps_avx(auVar57,auVar32);
              auVar32 = vcmpps_avx(auVar37,auVar32,0);
              auVar57 = local_340 & auVar32;
              auVar37 = local_340;
              if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar57[0xf] < '\0') {
                auVar37 = vandps_avx(auVar32,local_340);
              }
              uVar16 = vmovmskps_avx(auVar37);
              uVar18 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar16);
              lVar20 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
            } while( true );
          }
          local_1e0._0_16_ = auVar51._0_16_;
          local_e0 = (sphere->primIDs).field_0.i[lVar20];
          local_180._0_4_ = *(undefined4 *)(local_2a0 + lVar20 * 4);
          local_160 = *(undefined4 *)(local_290 + lVar20 * 4);
          auStack_b0 = vpshufd_avx(ZEXT416(uVar14),0);
          local_140._4_4_ = *(undefined4 *)(local_280 + lVar20 * 4);
          local_180._4_4_ = local_180._0_4_;
          local_180._8_4_ = local_180._0_4_;
          local_180._12_4_ = local_180._0_4_;
          local_180._16_4_ = local_180._0_4_;
          local_180._20_4_ = local_180._0_4_;
          local_180._24_4_ = local_180._0_4_;
          local_180._28_4_ = local_180._0_4_;
          uStack_15c = local_160;
          uStack_158 = local_160;
          uStack_154 = local_160;
          uStack_150 = local_160;
          uStack_14c = local_160;
          uStack_148 = local_160;
          uStack_144 = local_160;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          local_100 = ZEXT432(0) << 0x20;
          local_120 = ZEXT432(0) << 0x20;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = auStack_b0;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2b0 + lVar20 * 4);
          local_320 = *(undefined8 *)(mm_lookupmask_ps + uVar21);
          uStack_318 = *(undefined8 *)(mm_lookupmask_ps + uVar21 + 8);
          local_310 = *(undefined8 *)local_328;
          uStack_308 = *(undefined8 *)((long)local_328 + 8);
          local_2d8 = pGVar4->userPtr;
          local_2d0 = context->user;
          local_2c0 = &local_180;
          local_2b8 = 8;
          pRVar17 = (RayHitK<8> *)pGVar4->intersectionFilterN;
          if (pRVar17 != (RayHitK<8> *)0x0) {
            local_300 = auVar56._0_16_;
            local_2e8 = sphere;
            local_270 = auVar38;
            local_260 = auVar29;
            local_250 = auVar46;
            local_240 = auVar57;
            local_230 = auVar32;
            local_220 = auVar37;
            local_210 = auVar30;
            local_200 = auVar44;
            local_1f0 = auVar53;
            pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2e0);
            auVar69 = ZEXT1664(local_270);
            auVar68 = ZEXT1664(local_260);
            auVar67 = ZEXT1664(local_250);
            auVar63 = ZEXT1664(local_240);
            auVar61 = ZEXT1664(local_230);
            auVar59 = ZEXT1664(local_220);
            auVar66 = ZEXT1664(local_210);
            auVar65 = ZEXT1664(local_200);
            auVar64 = ZEXT1664(local_1f0);
            auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar56 = ZEXT1664(local_300);
            sphere = local_2e8;
          }
          auVar6._8_8_ = uStack_318;
          auVar6._0_8_ = local_320;
          auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,auVar6);
          auVar10._8_8_ = uStack_308;
          auVar10._0_8_ = local_310;
          auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,auVar10);
          auVar25._16_16_ = auVar32;
          auVar25._0_16_ = auVar37;
          auVar25 = local_1c0 & ~auVar25;
          auVar51 = ZEXT1664(local_1e0._0_16_);
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
            auVar26._0_4_ = auVar37._0_4_ ^ local_1c0._0_4_;
            auVar26._4_4_ = auVar37._4_4_ ^ local_1c0._4_4_;
            auVar26._8_4_ = auVar37._8_4_ ^ local_1c0._8_4_;
            auVar26._12_4_ = auVar37._12_4_ ^ local_1c0._12_4_;
            auVar26._16_4_ = auVar32._0_4_ ^ local_1c0._16_4_;
            auVar26._20_4_ = auVar32._4_4_ ^ local_1c0._20_4_;
            auVar26._24_4_ = auVar32._8_4_ ^ local_1c0._24_4_;
            auVar26._28_4_ = auVar32._12_4_ ^ local_1c0._28_4_;
          }
          else {
            pRVar17 = (RayHitK<8> *)context->args->filter;
            if ((pRVar17 != (RayHitK<8> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              local_300 = auVar56._0_16_;
              local_1f0 = auVar64._0_16_;
              local_200 = auVar65._0_16_;
              local_210 = auVar66._0_16_;
              local_220 = auVar59._0_16_;
              local_230 = auVar61._0_16_;
              local_240 = auVar63._0_16_;
              local_250 = auVar67._0_16_;
              local_260 = auVar68._0_16_;
              local_270 = auVar69._0_16_;
              pRVar17 = (RayHitK<8> *)(*(code *)pRVar17)(&local_2e0);
              auVar51 = ZEXT1664(local_1e0._0_16_);
              auVar69 = ZEXT1664(local_270);
              auVar68 = ZEXT1664(local_260);
              auVar67 = ZEXT1664(local_250);
              auVar63 = ZEXT1664(local_240);
              auVar61 = ZEXT1664(local_230);
              auVar59 = ZEXT1664(local_220);
              auVar66 = ZEXT1664(local_210);
              auVar65 = ZEXT1664(local_200);
              auVar64 = ZEXT1664(local_1f0);
              auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar56 = ZEXT1664(local_300);
            }
            auVar7._8_8_ = uStack_318;
            auVar7._0_8_ = local_320;
            auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,auVar7);
            auVar11._8_8_ = uStack_308;
            auVar11._0_8_ = local_310;
            auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,auVar11);
            auVar34._16_16_ = auVar32;
            auVar34._0_16_ = auVar37;
            auVar26._0_4_ = auVar37._0_4_ ^ local_1c0._0_4_;
            auVar26._4_4_ = auVar37._4_4_ ^ local_1c0._4_4_;
            auVar26._8_4_ = auVar37._8_4_ ^ local_1c0._8_4_;
            auVar26._12_4_ = auVar37._12_4_ ^ local_1c0._12_4_;
            auVar26._16_4_ = auVar32._0_4_ ^ local_1c0._16_4_;
            auVar26._20_4_ = auVar32._4_4_ ^ local_1c0._20_4_;
            auVar26._24_4_ = auVar32._8_4_ ^ local_1c0._24_4_;
            auVar26._28_4_ = auVar32._12_4_ ^ local_1c0._28_4_;
            auVar25 = local_1c0 & ~auVar34;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar25 = vmaskmovps_avx(auVar26,*local_2c0);
              *(undefined1 (*) [32])(local_2c8 + 0x180) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[1]);
              *(undefined1 (*) [32])(local_2c8 + 0x1a0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[2]);
              *(undefined1 (*) [32])(local_2c8 + 0x1c0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[3]);
              *(undefined1 (*) [32])(local_2c8 + 0x1e0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[4]);
              *(undefined1 (*) [32])(local_2c8 + 0x200) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[5]);
              *(undefined1 (*) [32])(local_2c8 + 0x220) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[6]);
              *(undefined1 (*) [32])(local_2c8 + 0x240) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[7]);
              *(undefined1 (*) [32])(local_2c8 + 0x260) = auVar25;
              auVar25 = vmaskmovps_avx(auVar26,local_2c0[8]);
              *(undefined1 (*) [32])(local_2c8 + 0x280) = auVar25;
              pRVar17 = local_2c8;
            }
          }
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar16;
          }
          *(undefined4 *)(local_340 + lVar20 * 4) = 0;
          uVar16 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar22._4_4_ = uVar16;
          auVar22._0_4_ = uVar16;
          auVar22._8_4_ = uVar16;
          auVar22._12_4_ = uVar16;
          auVar37 = vcmpps_avx(auVar51._0_16_,auVar22,2);
          local_340 = vandps_avx(auVar37,local_340);
        }
        uVar16 = (undefined4)((ulong)pRVar17 >> 0x20);
        auVar57 = auVar63._0_16_;
        auVar37 = auVar59._0_16_;
        auVar32 = auVar61._0_16_;
        auVar30 = auVar66._0_16_;
        auVar44 = auVar65._0_16_;
        auVar46 = auVar67._0_16_;
        auVar53 = auVar64._0_16_;
        auVar38 = auVar69._0_16_;
        auVar29 = auVar68._0_16_;
        if ((((local_340 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_340 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_340 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_340[0xf]) goto LAB_00ea1d59;
        auVar37 = vblendvps_avx(auVar54._0_16_,auVar51._0_16_,local_340);
        auVar32 = vshufps_avx(auVar37,auVar37,0xb1);
        auVar32 = vminps_avx(auVar32,auVar37);
        auVar57 = vshufpd_avx(auVar32,auVar32,1);
        auVar32 = vminps_avx(auVar57,auVar32);
        auVar32 = vcmpps_avx(auVar37,auVar32,0);
        auVar57 = local_340 & auVar32;
        auVar37 = local_340;
        if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          auVar37 = vandps_avx(auVar32,local_340);
        }
        uVar15 = vmovmskps_avx(auVar37);
        lVar20 = 0;
        if (CONCAT44(uVar16,uVar15) != 0) {
          for (; (CONCAT44(uVar16,uVar15) >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }